

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::on_receive_data
          (peer_connection *this,error_code *error,size_t bytes_transferred)

{
  receive_buffer *this_00;
  bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void> *pbVar1;
  byte bVar2;
  short sVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  time_point tVar8;
  size_t sVar9;
  undefined4 extraout_var_01;
  int iVar10;
  error_code *ec_00;
  error_code *ec_01;
  int bytes_transferred_00;
  uint uVar11;
  error_code ec;
  cork _c;
  shared_ptr<libtorrent::aux::torrent> t;
  shared_ptr<libtorrent::aux::peer_connection> me;
  error_code local_40;
  
  iVar6 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  bytes_transferred_00 = (int)bytes_transferred;
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar6) + 0x68) < 0) {
    print_error_abi_cxx11_((string *)&t,(libtorrent *)error,ec_00);
    peer_log(this,incoming,"ON_RECEIVE_DATA","bytes: %d %s",bytes_transferred & 0xffffffff,
             t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ::std::__cxx11::string::~string((string *)&t);
  }
  counters::inc_stats_counter(this->m_counters,0x39,1);
  if (error->failed_ == true) {
    iVar6 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
              _vptr_session_logger[5])();
    if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar6) + 0x68) < 0) {
      print_error_abi_cxx11_((string *)&t,(libtorrent *)error,ec_01);
      peer_log(this,info,"ERROR","in peer_connection::on_receive_data_impl %s",
               t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ::std::__cxx11::string::~string((string *)&t);
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x30])(this,error,bytes_transferred);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,error,0xb,0);
    return;
  }
  lVar4 = (this->m_connect).__d.__r;
  tVar8 = time_now();
  (this->m_last_receive).m_time_diff.__r = (rep_conflict)(((long)tVar8.__d.__r - lVar4) / 1000000);
  (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)._vptr_session_logger
    [0x1f])();
  ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::peer_connection,void>
            ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&me,
             (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
  bVar2 = (this->m_channel_state).
          super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
          ._M_elems[0].m_val;
  _c.m_need_uncork = (bVar2 & 4) == 0;
  if (_c.m_need_uncork) {
    (this->m_channel_state).
    super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
    ._M_elems[0].m_val = bVar2 | 4;
  }
  this_00 = &this->m_recv_buffer;
  _c.m_pc = this;
  iVar7 = receive_buffer::max_receive(this_00);
  account_received_bytes(this,bytes_transferred_00);
  iVar6 = this->m_extension_outstanding_bytes;
  if (0 < iVar6) {
    iVar10 = bytes_transferred_00;
    if (iVar6 < bytes_transferred_00) {
      iVar10 = iVar6;
    }
    this->m_extension_outstanding_bytes = iVar6 - iVar10;
  }
  check_graceful_pause(this);
  if (((this->super_peer_connection_hot_members).field_0x28 & 1) == 0) {
    if (iVar7 == bytes_transferred_00) {
      ec._0_8_ = ec._5_8_ << 0x28;
      ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                 super_error_category;
      sVar9 = polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              ::available(&this->m_socket,&ec);
      if (ec.failed_ == true) {
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&ec,0xe,0);
        goto LAB_0022b249;
      }
      uVar11 = (uint)sVar9;
      peer_log(this,incoming,"AVAILABLE","%d bytes",sVar9 & 0xffffffff);
      request_bandwidth(this,1,uVar11);
      if (this->m_quota[1] < (int)uVar11) {
        uVar11 = this->m_quota[1];
      }
      if (0 < (int)uVar11) {
        t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
             receive_buffer::reserve(this_00,uVar11);
        sVar9 = polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                ::read_some<boost::asio::mutable_buffer>(&this->m_socket,(mutable_buffer *)&t,&ec);
        if ((sVar9 == 0) && (ec.failed_ == false)) {
          ec = boost::asio::error::make_error_code(eof);
        }
        iVar6 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar6) + 0x68) < 0) {
          if (ec.failed_ == true) {
            (*(ec.cat_)->_vptr_error_category[4])(&t,ec.cat_,(ulong)(uint)ec.val_);
            peer_log(this,incoming,"SYNC_READ","max: %d ret: %d e: %s",(ulong)uVar11,
                     sVar9 & 0xffffffff,
                     t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
            ::std::__cxx11::string::~string((string *)&t);
          }
          else {
            peer_log(this,incoming,"SYNC_READ","max: %d ret: %d e: %s",(ulong)uVar11,
                     sVar9 & 0xffffffff,"");
          }
        }
        if (ec.failed_ == true) {
          t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
               boost::asio::error::make_error_code(try_again);
          bVar5 = boost::system::operator!=(&ec,(error_code *)&t);
          if (bVar5) {
            local_40 = boost::asio::error::make_error_code(try_again);
            bVar5 = boost::system::operator!=(&ec,&local_40);
            if (bVar5) {
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&ec,0xb,0);
              goto LAB_0022b249;
            }
          }
        }
        else {
          account_received_bytes(this,(int)sVar9);
          bytes_transferred = (size_t)(uint)((int)sVar9 + bytes_transferred_00);
        }
      }
    }
    sVar3 = *(short *)&this->field_0x885;
    do {
      iVar6 = receive_buffer::advance_pos(this_00,(int)bytes_transferred);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x30])(this,error,(long)iVar6);
      if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_0022b249;
    } while ((0 < iVar6) &&
            (uVar11 = (int)bytes_transferred - iVar6, bytes_transferred = (size_t)uVar11,
            0 < (int)uVar11));
    iVar6 = 100;
    if (sVar3 < 0) {
      iVar6 = 0;
    }
    if (-1 < *(short *)&this->field_0x885) {
      iVar6 = 0;
    }
    receive_buffer::normalize(this_00,iVar6);
    iVar6 = receive_buffer::max_receive(this_00);
    if (iVar6 == 0) {
      iVar6 = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x403d)
      ;
      receive_buffer::grow(this_00,iVar6);
      peer_log(this,incoming,"GROW_BUFFER","%d bytes",
               (ulong)(uint)(this->m_recv_buffer).m_recv_buffer.m_size);
    }
    bVar5 = is_seed(this);
    if (bVar5) {
      ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->super_peer_connection_hot_members).m_torrent);
      if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        torrent::seen_complete
                  (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  );
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    pbVar1 = (this->m_channel_state).
             super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
             ._M_elems + 1;
    pbVar1->m_val = pbVar1->m_val & 0xfb;
    setup_receive(this);
    if ((*(ushort *)&this->field_0x885 >> 0xd & 1) != 0) {
      *(ushort *)&this->field_0x885 = *(ushort *)&this->field_0x885 & 0xdfff;
      send_block_requests_impl(this);
    }
  }
LAB_0022b249:
  cork::~cork(&_c);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&me.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void peer_connection::on_receive_data(error_code const& error
		, std::size_t bytes_transferred)
	{
		TORRENT_ASSERT(is_single_thread());
		COMPLETE_ASYNC("peer_connection::on_receive_data");

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming))
		{
			peer_log(peer_log_alert::incoming, "ON_RECEIVE_DATA"
				, "bytes: %d %s"
				, int(bytes_transferred), print_error(error).c_str());
		}
#endif

		// leave this bit set until we're done looping, reading from the socket.
		// that way we don't trigger any async read calls until the end of this
		// function.
		TORRENT_ASSERT(m_channel_state[download_channel] & peer_info::bw_network);

		TORRENT_ASSERT(bytes_transferred > 0 || error);

		m_counters.inc_stats_counter(counters::on_read_counter);

		INVARIANT_CHECK;

		if (error)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "ERROR"
					, "in peer_connection::on_receive_data_impl %s"
					, print_error(error).c_str());
			}
#endif
			on_receive(error, bytes_transferred);
			disconnect(error, operation_t::sock_read);
			return;
		}

		m_last_receive.set(m_connect, aux::time_now());

		// submit all disk jobs later
		m_ses.deferred_submit_jobs();

		// keep ourselves alive in until this function exits in
		// case we disconnect
		// this needs to be created before the invariant check,
		// to keep the object alive through the exit check
		std::shared_ptr<peer_connection> me(self());

		TORRENT_ASSERT(bytes_transferred > 0);

		// flush the send buffer at the end of this function
		cork _c(*this);

		// if we received exactly as many bytes as we provided a receive buffer
		// for. There most likely are more bytes to read, and we should grow our
		// receive buffer.
		TORRENT_ASSERT(int(bytes_transferred) <= m_recv_buffer.max_receive());
		bool const grow_buffer = (int(bytes_transferred) == m_recv_buffer.max_receive());
		account_received_bytes(int(bytes_transferred));

		if (m_extension_outstanding_bytes > 0)
			m_extension_outstanding_bytes -= std::min(m_extension_outstanding_bytes, int(bytes_transferred));

		check_graceful_pause();
		if (m_disconnecting) return;

		// this is the case where we try to grow the receive buffer and try to
		// drain the socket
		if (grow_buffer)
		{
			error_code ec;
			int buffer_size = int(m_socket.available(ec));
			if (ec)
			{
				disconnect(ec, operation_t::available);
				return;
			}

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming, "AVAILABLE"
				, "%d bytes", buffer_size);
#endif

			request_bandwidth(download_channel, buffer_size);

			int const quota_left = m_quota[download_channel];
			if (buffer_size > quota_left) buffer_size = quota_left;
			if (buffer_size > 0)
			{
				span<char> const vec = m_recv_buffer.reserve(buffer_size);
				std::size_t const bytes = m_socket.read_some(
					boost::asio::mutable_buffer(vec.data(), std::size_t(vec.size())), ec);

				// this is weird. You would imagine read_some() would do this
				if (bytes == 0 && !ec) ec = boost::asio::error::eof;

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log(peer_log_alert::incoming))
				{
					peer_log(peer_log_alert::incoming, "SYNC_READ", "max: %d ret: %d e: %s"
						, buffer_size, int(bytes), ec ? ec.message().c_str() : "");
				}
#endif

				TORRENT_ASSERT(bytes > 0 || ec);
				if (ec)
				{
					if (ec != boost::asio::error::would_block
						&& ec != boost::asio::error::try_again)
					{
						disconnect(ec, operation_t::sock_read);
						return;
					}
				}
				else
				{
					account_received_bytes(int(bytes));
					bytes_transferred += bytes;
				}
			}
		}

		// feed bytes in receive buffer to upper layer by calling on_receive()

		bool const prev_choked = m_peer_choked;
		int bytes = int(bytes_transferred);
		int sub_transferred = 0;
		do {
			sub_transferred = m_recv_buffer.advance_pos(bytes);
			TORRENT_ASSERT(sub_transferred > 0);
			on_receive(error, std::size_t(sub_transferred));
			bytes -= sub_transferred;
			if (m_disconnecting) return;
		} while (bytes > 0 && sub_transferred > 0);

		// if the peer went from unchoked to choked, suggest to the receive
		// buffer that it shrinks to 100 bytes
		int const force_shrink = (m_peer_choked && !prev_choked)
			? 100 : 0;
		m_recv_buffer.normalize(force_shrink);

		if (m_recv_buffer.max_receive() == 0)
		{
			// the message we're receiving is larger than our receive
			// buffer, we must grow.
			int const buffer_size_limit
				= m_settings.get_int(settings_pack::max_peer_recv_buffer_size);
			m_recv_buffer.grow(buffer_size_limit);
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming, "GROW_BUFFER", "%d bytes"
				, m_recv_buffer.capacity());
#endif
		}

		TORRENT_ASSERT(m_recv_buffer.pos_at_end());
		TORRENT_ASSERT(m_recv_buffer.packet_size() > 0);

		if (is_seed())
		{
			auto t = m_torrent.lock();
			if (t) t->seen_complete();
		}

		// allow reading from the socket again
		TORRENT_ASSERT(m_channel_state[download_channel] & peer_info::bw_network);
		m_channel_state[download_channel] &= ~peer_info::bw_network;

		setup_receive();

		if (m_deferred_send_block_requests)
		{
			m_deferred_send_block_requests = false;
			send_block_requests_impl();
		}
	}